

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptWeakSet.cpp
# Opt level: O0

Var Js::JavascriptWeakSet::EntryDelete(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int n;
  BOOL BVar3;
  ScriptContext *pSVar4;
  ThreadContext *pTVar5;
  Var *values;
  undefined4 *puVar6;
  Var pvVar7;
  JavascriptWeakSet *this;
  RecyclableObject *pRVar8;
  ScriptContext *pSVar9;
  JavascriptLibrary *pJVar10;
  JavascriptBoolean *pJVar11;
  CallInfo local_98;
  RecyclableObject *keyObj;
  bool didDelete;
  Var key;
  JavascriptWeakSet *weakSet;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  TypeId local_18;
  TypeId typeId;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar4 = RecyclableObject::GetScriptContext(function);
  pTVar5 = ScriptContext::GetThreadContext(pSVar4);
  pSVar4 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(pTVar5,0xc00,pSVar4,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptWeakSet.cpp"
                                ,0x76,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  pSVar4 = RecyclableObject::GetScriptContext(function);
  pvVar7 = Arguments::operator[]((Arguments *)&scriptContext,0);
  bVar2 = VarIs<Js::JavascriptWeakSet>(pvVar7);
  if (bVar2) {
    pvVar7 = Arguments::operator[]((Arguments *)&scriptContext,0);
    this = VarTo<Js::JavascriptWeakSet>(pvVar7);
    if (((uint)scriptContext & 0xffffff) == 1 || ((ulong)scriptContext & 0xffffff) == 0) {
      pJVar10 = ScriptContext::GetLibrary(pSVar4);
      local_98 = (CallInfo)
                 JavascriptLibraryBase::GetUndefined(&pJVar10->super_JavascriptLibraryBase);
    }
    else {
      local_98 = (CallInfo)Arguments::operator[]((Arguments *)&scriptContext,1);
    }
    keyObj._7_1_ = false;
    BVar3 = Js::JavascriptOperators::IsObject((Var)local_98);
    if (BVar3 != 0) {
      callInfo_local = local_98;
      if (local_98 == (CallInfo)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      bVar2 = TaggedInt::Is((Var)callInfo_local);
      if (bVar2) {
        local_18 = TypeIds_FirstNumberType;
      }
      else {
        bVar2 = JavascriptNumber::Is_NoTaggedIntCheck((Var)callInfo_local);
        if (bVar2) {
          local_18 = TypeIds_Number;
        }
        else {
          pRVar8 = UnsafeVarTo<Js::RecyclableObject>((Var)callInfo_local);
          if (pRVar8 == (RecyclableObject *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 0;
          }
          local_18 = RecyclableObject::GetTypeId(pRVar8);
          if ((0x57 < (int)local_18) && (BVar3 = RecyclableObject::IsExternal(pRVar8), BVar3 == 0))
          {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                        "GetTypeId aValue has invalid TypeId");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 0;
          }
        }
      }
      if (local_18 != TypeIds_HostDispatch) {
        pRVar8 = VarTo<Js::RecyclableObject>((Var)local_98);
        keyObj._7_1_ = Delete(this,pRVar8);
      }
    }
    bVar2 = ScriptContext::IsTTDRecordOrReplayModeEnabled(pSVar4);
    if (bVar2) {
      bVar2 = ScriptContext::IsTTDRecordModeEnabled(pSVar4);
      if (bVar2) {
        pSVar9 = RecyclableObject::GetScriptContext(function);
        pTVar5 = ScriptContext::GetThreadContext(pSVar9);
        TTD::EventLog::RecordWeakCollectionContainsEvent(pTVar5->TTDLog,keyObj._7_1_);
      }
      else {
        pSVar9 = RecyclableObject::GetScriptContext(function);
        pTVar5 = ScriptContext::GetThreadContext(pSVar9);
        keyObj._7_1_ = TTD::EventLog::ReplayWeakCollectionContainsEvent(pTVar5->TTDLog);
      }
    }
    pJVar10 = ScriptContext::GetLibrary(pSVar4);
    pJVar11 = JavascriptLibrary::CreateBoolean(pJVar10,(uint)keyObj._7_1_);
    return pJVar11;
  }
  JavascriptError::ThrowTypeErrorVar(pSVar4,-0x7ff5ec04,L"WeakSet.prototype.delete",L"WeakSet");
}

Assistant:

Var JavascriptWeakSet::EntryDelete(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        if (!VarIs<JavascriptWeakSet>(args[0]))
        {
            JavascriptError::ThrowTypeErrorVar(scriptContext, JSERR_NeedObjectOfType, _u("WeakSet.prototype.delete"), _u("WeakSet"));
        }

        JavascriptWeakSet* weakSet = VarTo<JavascriptWeakSet>(args[0]);

        Var key = (args.Info.Count > 1) ? args[1] : scriptContext->GetLibrary()->GetUndefined();
        bool didDelete = false;

        if (JavascriptOperators::IsObject(key) && JavascriptOperators::GetTypeId(key) != TypeIds_HostDispatch)
        {
            RecyclableObject* keyObj = VarTo<RecyclableObject>(key);

            didDelete = weakSet->Delete(keyObj);
        }

#if ENABLE_TTD
        if(scriptContext->IsTTDRecordOrReplayModeEnabled())
        {
            if(scriptContext->IsTTDRecordModeEnabled())
            {
                function->GetScriptContext()->GetThreadContext()->TTDLog->RecordWeakCollectionContainsEvent(didDelete);
            }
            else
            {
                didDelete = function->GetScriptContext()->GetThreadContext()->TTDLog->ReplayWeakCollectionContainsEvent();
            }
        }
#endif

        return scriptContext->GetLibrary()->CreateBoolean(didDelete);
    }